

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parser::operator==(Convolution *lhs,Convolution *rhs)

{
  bool local_19;
  Convolution *rhs_local;
  Convolution *lhs_local;
  
  local_19 = false;
  if (lhs->header == rhs->header) {
    local_19 = std::operator==(&lhs->body,&rhs->body);
  }
  return local_19;
}

Assistant:

bool operator==(const Convolution& lhs, const Convolution& rhs) {
            return lhs.header == rhs.header &&
                   lhs.body == rhs.body;
        }